

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileimagewindow.cc
# Opt level: O1

void __thiscall bgui::FileImageWindow::updateTitle(FileImageWindow *this)

{
  pointer pbVar1;
  pointer pcVar2;
  int iVar3;
  ImageAdapterBase *pIVar4;
  ostream *poVar5;
  string name;
  ostringstream os;
  char *local_1d8;
  long local_1d0;
  char local_1c8 [16];
  char *local_1b8;
  long local_1b0;
  char local_1a8 [16];
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  pIVar4 = ImageWindow::getAdapter(&this->super_ImageWindow);
  if (pIVar4 != (ImageAdapterBase *)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_198);
    pbVar1 = (this->list).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar2 = pbVar1[this->current]._M_dataplus._M_p;
    local_1b8 = local_1a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b8,pcVar2,pcVar2 + pbVar1[this->current]._M_string_length);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_198,local_1b8,local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," - ",3);
    (*pIVar4->_vptr_ImageAdapterBase[5])(pIVar4);
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"x",1);
    (*pIVar4->_vptr_ImageAdapterBase[6])(pIVar4);
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"x",1);
    iVar3 = (*pIVar4->_vptr_ImageAdapterBase[7])(pIVar4);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,iVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    (*pIVar4->_vptr_ImageAdapterBase[8])(&local_1d8,pIVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_1d8,local_1d0);
    if (local_1d8 != local_1c8) {
      operator_delete(local_1d8);
    }
    if ((this->watch_file != false) || (this->kp != keep_none)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198," -",2);
      if (this->watch_file == true) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198," ",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"watch",5);
      }
      if (this->kp == keep_most) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198," ",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"keep",4);
      }
      if (this->kp == keep_all) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198," ",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"keep_all",8);
      }
    }
    std::__cxx11::stringbuf::str();
    BaseWindow::setTitle((BaseWindow *)this,local_1d8);
    if (local_1d8 != local_1c8) {
      operator_delete(local_1d8);
    }
    if (local_1b8 != local_1a8) {
      operator_delete(local_1b8);
    }
    std::__cxx11::ostringstream::~ostringstream(local_198);
    std::ios_base::~ios_base(local_128);
    return;
  }
  ImageWindow::setAdapter
            (&this->super_ImageWindow,(ImageAdapterBase *)0x0,false,keep_none,-1,-1,false);
  BaseWindow::setTitle((BaseWindow *)this,"Image");
  BaseWindow::setInfoText((BaseWindow *)this,"No image!");
  return;
}

Assistant:

void FileImageWindow::updateTitle()
{
  ImageAdapterBase *adapt=getAdapter();

  // set image adapter and title

  if (adapt != 0)
  {
    std::ostringstream os;

    std::string name=list[current];

    os << name << " - " << adapt->getOriginalWidth() << "x" <<
       adapt->getOriginalHeight() << "x" << adapt->getOriginalDepth() <<
       " " << adapt->getOriginalType();

    if (watch_file || kp != keep_none)
    {
      os << " -";

      if (watch_file)
      {
        os << " " << "watch";
      }

      if (kp == keep_most)
      {
        os << " " << "keep";
      }

      if (kp == keep_all)
      {
        os << " " << "keep_all";
      }
    }

    setTitle(os.str().c_str());
  }
  else
  {
    setAdapter(0);
    setTitle("Image");
    setInfoText("No image!");
  }
}